

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O3

Vec_Int_t * Acb_NtkCollectUser(Acb_Ntk_t *p,Vec_Ptr_t *vUser)

{
  char *pStr;
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  void *__s;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  
  iVar2 = vUser->nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  if (iVar2 - 1U < 0xf) {
    iVar2 = 0x10;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar2;
  if (iVar2 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar2 << 2);
  }
  p_00->pArray = piVar4;
  iVar1 = Abc_NamObjNumMax(p->pDesign->pStrs);
  iVar2 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar2 = iVar1;
  }
  if ((iVar2 == 0) || (__s = malloc((long)iVar2 << 2), __s == (void *)0x0)) {
    __s = (void *)0x0;
  }
  else {
    memset(__s,0,(long)iVar1 << 2);
  }
  uVar5 = (ulong)(p->vObjType).nSize;
  if (1 < (long)uVar5) {
    uVar6 = 1;
    do {
      if (uVar5 <= uVar6) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      uVar3 = (uint)(byte)(p->vObjType).pArray[uVar6];
      if ((4 < uVar3) || ((0x19U >> (uVar3 & 0x1f) & 1) == 0)) {
        uVar9 = (ulong)(p->vObjName).nSize;
        if ((long)uVar9 < 1) {
          __assert_fail("Acb_NtkHasObjNames(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                        ,0x10d,"int Acb_ObjName(Acb_Ntk_t *, int)");
        }
        if (uVar9 <= uVar6) goto LAB_003afca9;
        iVar2 = (p->vObjName).pArray[uVar6];
        if (0 < (long)iVar2) {
          uVar9 = (ulong)(p->vObjCopy).nSize;
          if ((long)uVar9 < 1) {
            __assert_fail("Acb_NtkHasObjCopies(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                          ,0x108,"int Acb_ObjCopy(Acb_Ntk_t *, int)");
          }
          if (uVar9 <= uVar6) goto LAB_003afca9;
          if (iVar1 <= iVar2) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          *(int *)((long)__s + (long)iVar2 * 4) = (p->vObjCopy).pArray[uVar6];
        }
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < uVar5);
  }
  uVar3 = vUser->nSize;
  if ((int)uVar3 < 1) {
    uVar7 = 0;
  }
  else {
    lVar8 = 0;
    do {
      pStr = (char *)vUser->pArray[lVar8];
      iVar2 = Abc_NamStrFind(p->pDesign->pStrs,pStr);
      if (iVar2 < iVar1) {
        uVar3 = Abc_NamStrFind(p->pDesign->pStrs,pStr);
        if (((int)uVar3 < 0) || (iVar1 <= (int)uVar3)) {
LAB_003afca9:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar3 = *(uint *)((long)__s + (ulong)uVar3 * 4);
        if ((int)uVar3 < 1) {
          __assert_fail("iLit > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbUtil.c"
                        ,0x306,"Vec_Int_t *Acb_NtkCollectUser(Acb_Ntk_t *, Vec_Ptr_t *)");
        }
        Vec_IntPush(p_00,uVar3 >> 1);
      }
      lVar8 = lVar8 + 1;
      uVar3 = vUser->nSize;
    } while (lVar8 < (int)uVar3);
    uVar7 = p_00->nSize;
  }
  if (uVar7 != uVar3) {
    __assert_fail("Vec_IntSize(vRes) == Vec_PtrSize(vUser)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbUtil.c"
                  ,0x30a,"Vec_Int_t *Acb_NtkCollectUser(Acb_Ntk_t *, Vec_Ptr_t *)");
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (1 < (int)uVar7) {
    piVar4 = p_00->pArray;
    qsort(piVar4,(ulong)uVar7,4,Vec_IntSortCompare1);
    iVar2 = 1;
    uVar5 = 1;
    do {
      if (piVar4[uVar5] != piVar4[uVar5 - 1]) {
        lVar8 = (long)iVar2;
        iVar2 = iVar2 + 1;
        piVar4[lVar8] = piVar4[uVar5];
      }
      uVar5 = uVar5 + 1;
    } while (uVar7 != uVar5);
    p_00->nSize = iVar2;
  }
  return p_00;
}

Assistant:

Vec_Int_t * Acb_NtkCollectUser( Acb_Ntk_t * p, Vec_Ptr_t * vUser )
{
    char * pTemp; int i;
    Vec_Int_t * vRes = Vec_IntAlloc( Vec_PtrSize(vUser) );
    Vec_Int_t * vMap = Vec_IntStart( Abc_NamObjNumMax(Acb_NtkNam(p)) );
    Acb_NtkForEachNode( p, i )
        if ( Acb_ObjName(p, i) > 0 )
            Vec_IntWriteEntry( vMap, Acb_ObjName(p, i), Acb_ObjCopy(p, i) );
    Vec_PtrForEachEntry( char *, vUser, pTemp, i )
        if ( Acb_NtkStrId(p, pTemp) < Vec_IntSize(vMap) )
        {
            int iLit = Vec_IntEntry( vMap, Acb_NtkStrId(p, pTemp) );
            assert( iLit > 0 );
            //printf( "Obj = %3d  Name = %3d  Copy = %3d\n", i, Acb_NtkStrId(p, pTemp), iLit );
            Vec_IntPush( vRes, Abc_Lit2Var(iLit) );
        }
    assert( Vec_IntSize(vRes) == Vec_PtrSize(vUser) );
    Vec_IntFree( vMap );
    Vec_IntUniqify( vRes );
    return vRes;
}